

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_store_router_key_pdu
              (rtr_socket *rtr_socket,void *pdu,uint pdu_size,pdu_router_key **ary,uint *ind,
              uint *size)

{
  pdu_type pVar1;
  pdu_router_key *ppVar2;
  long in_FS_OFFSET;
  void *tmp;
  uint *size_local;
  uint *ind_local;
  pdu_router_key **ary_local;
  uint pdu_size_local;
  void *pdu_local;
  rtr_socket *rtr_socket_local;
  char local_1f [8];
  char txt [15];
  
  txt._7_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pVar1 = rtr_get_pdu_type(pdu);
  if (pVar1 != ROUTER_KEY) {
    __assert_fail("rtr_get_pdu_type(pdu) == ROUTER_KEY",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x36e,
                  "int rtr_store_router_key_pdu(struct rtr_socket *, const void *, const unsigned int, struct pdu_router_key **, unsigned int *, unsigned int *)"
                 );
  }
  if (*size <= *ind) {
    *size = *size + 100;
    ppVar2 = (pdu_router_key *)lrtr_realloc(*ary,(ulong)(*size * pdu_size));
    if (ppVar2 == (pdu_router_key *)0x0) {
      builtin_strncpy(local_1f,"Realloc ",8);
      builtin_strncpy(txt,"failed",7);
      lrtr_dbg("RTR Socket: %s",local_1f);
      rtr_send_error_pdu_from_host(rtr_socket,(void *)0x0,0,INTERNAL_ERROR,local_1f,0xf);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
      goto LAB_0010e0fb;
    }
    *ary = ppVar2;
  }
  memcpy(*ary + *ind,pdu,(ulong)pdu_size);
  *ind = *ind + 1;
  rtr_socket_local._4_4_ = 0;
LAB_0010e0fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == txt._7_8_) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_store_router_key_pdu(struct rtr_socket *rtr_socket, const void *pdu, const unsigned int pdu_size,
				    struct pdu_router_key **ary, unsigned int *ind, unsigned int *size)
{
	assert(rtr_get_pdu_type(pdu) == ROUTER_KEY);

	if (*ind >= *size) {
		*size += TEMPORARY_PDU_STORE_INCREMENT_VALUE;
		void *tmp = lrtr_realloc(*ary, *size * pdu_size);

		if (!tmp) {
			const char txt[] = "Realloc failed";

			RTR_DBG("%s", txt);
			rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
			rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
			return RTR_ERROR;
		}
		*ary = tmp;
	}

	memcpy((struct pdu_router_key *)*ary + *ind, pdu, pdu_size);
	(*ind)++;
	return RTR_SUCCESS;
}